

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

bool __thiscall
MD5::checkFileChecksum(MD5 *this,char *checksum,char *filename,qpdf_offset_t up_to_offset)

{
  runtime_error *anon_var_0;
  undefined1 local_48 [8];
  string actual_checksum;
  bool result;
  qpdf_offset_t up_to_offset_local;
  char *filename_local;
  char *checksum_local;
  
  actual_checksum.field_2._M_local_buf[0xf] = '\0';
  getFileChecksum_abi_cxx11_((string *)local_48,(MD5 *)checksum,filename,up_to_offset);
  actual_checksum.field_2._M_local_buf[0xf] =
       std::operator==((char *)this,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(actual_checksum.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool
MD5::checkFileChecksum(char const* const checksum, char const* filename, qpdf_offset_t up_to_offset)
{
    bool result = false;
    try {
        std::string actual_checksum = getFileChecksum(filename, up_to_offset);
        result = (checksum == actual_checksum);
    } catch (std::runtime_error const&) {
        // Ignore -- return false
    }
    return result;
}